

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_get_auxdata(sqlite3_context *pCtx,int iArg)

{
  AuxData *local_28;
  AuxData *pAuxData;
  int iArg_local;
  sqlite3_context *pCtx_local;
  
  if (pCtx->pVdbe != (Vdbe *)0x0) {
    for (local_28 = pCtx->pVdbe->pAuxData; local_28 != (AuxData *)0x0; local_28 = local_28->pNextAux
        ) {
      if ((local_28->iAuxArg == iArg) && ((local_28->iAuxOp == pCtx->iOp || (iArg < 0)))) {
        return local_28->pAux;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

SQLITE_API void *sqlite3_get_auxdata(sqlite3_context *pCtx, int iArg){
  AuxData *pAuxData;

  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
#if SQLITE_ENABLE_STAT3_OR_STAT4
  if( pCtx->pVdbe==0 ) return 0;
#else
  assert( pCtx->pVdbe!=0 );
#endif
  for(pAuxData=pCtx->pVdbe->pAuxData; pAuxData; pAuxData=pAuxData->pNextAux){
    if(  pAuxData->iAuxArg==iArg && (pAuxData->iAuxOp==pCtx->iOp || iArg<0) ){
      return pAuxData->pAux;
    }
  }
  return 0;
}